

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Le
          (PortalImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  bool bVar1;
  Point2<float> *pt;
  Bounds2<float> *b_00;
  Tuple2<pbrt::Point2,_float> *pTVar2;
  undefined1 auVar4 [56];
  undefined1 auVar3 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar5 [64];
  Vector3<float> wRender;
  SampledSpectrum SVar7;
  optional<pbrt::Point2<float>_> uv;
  optional<pbrt::Bounds2<float>_> b;
  undefined1 local_4c [12];
  SampledSpectrum local_40;
  optional<pbrt::Bounds2<float>_> local_2c;
  undefined1 auVar6 [56];
  
  auVar6 = in_ZMM1._8_56_;
  wRender = Normalize<float>(&ray->d);
  ImageFromRender((PortalImageInfiniteLight *)local_4c,
                  (Vector3f)wRender.super_Tuple3<pbrt::Vector3,_float>,(Float *)this);
  ImageBounds(&local_2c,this,&ray->o);
  if ((local_4c[8] == true) && (local_2c.set == true)) {
    pt = pstd::optional<pbrt::Point2<float>_>::value((optional<pbrt::Point2<float>_> *)local_4c);
    b_00 = pstd::optional<pbrt::Bounds2<float>_>::value(&local_2c);
    bVar1 = Inside<float>(pt,b_00);
    if (bVar1) {
      pTVar2 = &pstd::optional<pbrt::Point2<float>_>::value
                          ((optional<pbrt::Point2<float>_> *)local_4c)->
                super_Tuple2<pbrt::Point2,_float>;
      auVar4 = ZEXT856(0);
      SVar7 = ImageLookup(this,(Point2f)*pTVar2,lambda);
      auVar5._0_8_ = SVar7.values.values._8_8_;
      auVar5._8_56_ = auVar6;
      auVar3._0_8_ = SVar7.values.values._0_8_;
      auVar3._8_56_ = auVar4;
      local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar3._0_16_,auVar5._0_16_);
      goto LAB_00315643;
    }
  }
  SampledSpectrum::SampledSpectrum(&local_40,0.0);
LAB_00315643:
  pstd::optional<pbrt::Bounds2<float>_>::~optional(&local_2c);
  pstd::optional<pbrt::Point2<float>_>::~optional((optional<pbrt::Point2<float>_> *)local_4c);
  return (array<float,_4>)(array<float,_4>)local_40;
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Le(const Ray &ray,
                                             const SampledWavelengths &lambda) const {
    pstd::optional<Point2f> uv = ImageFromRender(Normalize(ray.d));
    pstd::optional<Bounds2f> b = ImageBounds(ray.o);
    if (!uv || !b || !Inside(*uv, *b))
        return SampledSpectrum(0.f);
    return ImageLookup(*uv, lambda);
}